

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::merge(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
        *this,btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
              *src,allocator_type *alloc)

{
  allocator_type *paVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  field_type fVar5;
  field_type fVar6;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *pbVar7;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *pbVar8;
  int local_2c;
  slot_type *psStack_28;
  int i;
  allocator_type *local_20;
  allocator_type *alloc_local;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *src_local;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *this_local;
  
  local_20 = alloc;
  alloc_local = (allocator_type *)src;
  src_local = this;
  pbVar7 = parent(this);
  pbVar8 = parent((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                   *)alloc_local);
  if (pbVar7 != pbVar8) {
    __assert_fail("parent() == src->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x923,
                  "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 256, false>]"
                 );
  }
  bVar2 = position(this);
  bVar3 = position((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                    *)alloc_local);
  if (bVar2 + 1 != (uint)bVar3) {
    __assert_fail("position() + 1 == src->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x924,
                  "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::Less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 256, false>]"
                 );
  }
  bVar2 = count(this);
  paVar1 = local_20;
  pbVar7 = parent(this);
  bVar3 = position(this);
  psStack_28 = slot(pbVar7,(ulong)bVar3);
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::Less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
  ::value_init<phmap::test_internal::MovableOnlyInstance*>
            ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::Less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
              *)this,(ulong)bVar2,paVar1,&stack0xffffffffffffffd8);
  paVar1 = alloc_local;
  bVar2 = count((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                 *)alloc_local);
  bVar3 = count(this);
  uninitialized_move_n
            ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
              *)paVar1,(ulong)bVar2,0,(long)(int)(bVar3 + 1),this,local_20);
  paVar1 = alloc_local;
  bVar2 = count((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                 *)alloc_local);
  value_destroy_n((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                   *)paVar1,0,(ulong)bVar2,local_20);
  bVar4 = leaf(this);
  if (!bVar4) {
    for (local_2c = 0;
        bVar2 = count((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                       *)alloc_local), local_2c <= (int)(uint)bVar2; local_2c = local_2c + 1) {
      bVar2 = count(this);
      pbVar7 = child((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                      *)alloc_local,(long)local_2c);
      init_child(this,(uint)bVar2 + local_2c + 1,pbVar7);
      clear_child((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                   *)alloc_local,(long)local_2c);
    }
  }
  fVar5 = count(this);
  fVar6 = count((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
                 *)alloc_local);
  set_count(this,fVar5 + '\x01' + fVar6);
  set_count((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::Less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
             *)alloc_local,'\0');
  pbVar7 = parent(this);
  bVar2 = position(this);
  remove_value(pbVar7,(uint)bVar2,local_20);
  return;
}

Assistant:

void btree_node<P>::merge(btree_node *src, allocator_type *alloc) {
        assert(parent() == src->parent());
        assert(position() + 1 == src->position());

        // Move the delimiting value to the left node.
        value_init(count(), alloc, parent()->slot(position()));

        // Move the values from the right to the left node.
        src->uninitialized_move_n(src->count(), 0, count() + 1, this, alloc);

        // Destroy the now-empty entries in the right node.
        src->value_destroy_n(0, src->count(), alloc);

        if (!leaf()) {
            // Move the child pointers from the right to the left node.
            for (int i = 0; i <= src->count(); ++i) {
                init_child(count() + i + 1, src->child(i));
                src->clear_child(i);
            }
        }

        // Fixup the counts on the src and dest nodes.
        set_count((field_type)(1 + count() + src->count()));
        src->set_count(0);

        // Remove the value on the parent node.
        parent()->remove_value(position(), alloc);
    }